

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-algebra.cc
# Opt level: O1

float3 tinyusdz::vnormalize(float3 *a,float eps)

{
  float fVar1;
  float __x;
  float3 fVar2;
  
  __x = a->_M_elems[2] * a->_M_elems[2] +
        a->_M_elems[0] * a->_M_elems[0] + a->_M_elems[1] * a->_M_elems[1];
  fVar1 = 0.0;
  if (1.1920929e-07 < __x) {
    if (__x < 0.0) {
      fVar1 = sqrtf(__x);
    }
    else {
      fVar1 = SQRT(__x);
    }
  }
  if (fVar1 <= eps) {
    fVar1 = eps;
  }
  fVar2._M_elems[2] = a->_M_elems[2] / fVar1;
  fVar2._M_elems[1] = a->_M_elems[1] / fVar1;
  fVar2._M_elems[0] = a->_M_elems[0] / fVar1;
  return (float3)fVar2._M_elems;
}

Assistant:

value::float3 vnormalize(const value::float3 &a, const float eps) {
  float len = vlength(a);
  len = (len > eps) ? len : eps;
  return value::float3({a[0] / len, a[1] / len, a[2] / len});
}